

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O2

void __thiscall
ParamListStandard::forceInactiveChain
          (ParamListStandard *this,ParamActive *active,int4 maxchain,int4 start,int4 stop)

{
  ParamTrial *this_00;
  uint uVar1;
  ParamTrial *this_01;
  long lVar2;
  pointer pPVar3;
  int4 iVar4;
  int4 iVar5;
  bool bVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int local_60;
  
  lVar10 = (long)start;
  lVar7 = lVar10 * 0x30;
  local_60 = -1;
  iVar8 = 0;
  bVar6 = false;
  for (lVar11 = 0; lVar11 + lVar10 < (long)stop; lVar11 = lVar11 + 1) {
    this_01 = (active->trial).super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar2 = *(long *)((long)&this_01->entry + lVar7);
    if (lVar2 != 0) {
      this_00 = (ParamTrial *)((long)&this_01->flags + lVar7);
      if ((this_00->flags & 8) == 0) {
        if ((((this_00->flags & 0x10) != 0) && (active->recoversubcall == true)) &&
           (*(int *)(*(long *)((long)&(this_01->addr).base + lVar7) + 8) == 2)) {
          bVar6 = true;
        }
        if (lVar11 == 0) {
          if (*(int *)(lVar2 + 4) == 3) {
            iVar4 = ParamTrial::slotGroup(this_01);
            iVar9 = iVar4 + 1;
          }
          else {
            iVar4 = ParamTrial::slotGroup(this_00);
            iVar9 = (iVar4 - this->nonfloatgroup) + 1;
          }
        }
        else {
          iVar4 = ParamTrial::slotGroup(this_00);
          iVar5 = ParamTrial::slotGroup
                            ((ParamTrial *)
                             ((long)&(active->trial).
                                     super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>.
                                     _M_impl.super__Vector_impl_data._M_start[-1].flags + lVar7));
          iVar9 = iVar4 - iVar5;
        }
        iVar8 = iVar8 + iVar9;
        if (maxchain < iVar8) {
          bVar6 = true;
        }
      }
      else {
        if (!bVar6) {
          local_60 = start + (int)lVar11;
        }
        iVar8 = 0;
      }
      if (bVar6) {
        this_00->flags = (this_00->flags & 0xfffffff6) + 1;
      }
    }
    lVar7 = lVar7 + 0x30;
  }
  lVar7 = lVar10 * 0x30;
  for (; lVar10 <= local_60; lVar10 = lVar10 + 1) {
    pPVar3 = (active->trial).super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = *(uint *)((long)&pPVar3->flags + lVar7);
    if ((uVar1 & 0xc) == 0) {
      *(uint *)((long)&pPVar3->flags + lVar7) = uVar1 | 9;
    }
    lVar7 = lVar7 + 0x30;
  }
  return;
}

Assistant:

void ParamListStandard::forceInactiveChain(ParamActive *active,int4 maxchain,int4 start,int4 stop) const

{
  bool seenchain = false;
  int4 chainlength = 0;
  int4 max = -1;
  for(int4 i=start;i<stop;++i) {
    ParamTrial &trial(active->getTrial(i));
    if (trial.getEntry() == (const ParamEntry *)0) continue; // Already know not used
    if (!trial.isActive()) {
      if (trial.isUnref()&&active->isRecoverSubcall()) {
	// If there is no reference to the trial within the function, the only real possibility
	// is that a register is an input to the calling function and it is being reused (immediately)
	// to pass the input into the called function.  This really can't happen on the stack because
	// the stack relative caller offset and callee offset are different
	if (trial.getAddress().getSpace()->getType() == IPTR_SPACEBASE) // So if the parameter is on the stack
	  seenchain = true;	// Mark that we have already seen an inactive chain
      }
      if (i==start) {
	if (trial.getEntry()->getType() == TYPE_FLOAT)
	  chainlength += (active->getTrial(0).slotGroup()+1);
	else
	  chainlength += (trial.slotGroup() - nonfloatgroup + 1);
      }
      else
	chainlength += trial.slotGroup() - active->getTrial(i-1).slotGroup();
      if (chainlength > maxchain)
	seenchain = true;
    }
    else {
      chainlength = 0;
      if (!seenchain)
	max = i;
    }
    if (seenchain)
      trial.markInactive();
  }
  for(int4 i=start;i<=max;++i) { // Across the range of active trials, fill in "holes" of inactive trials
    ParamTrial &trial(active->getTrial(i));
    if (trial.isDefinitelyNotUsed()) continue;
    if (!trial.isActive())
      trial.markActive();
  }
}